

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmtm.c
# Opt level: O1

int it_mtm_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  char *ptr;
  long lVar4;
  
  if ((sample->flags & 0x10) != 0) {
    iVar3 = sample->loop_end;
    iVar2 = sample->length - iVar3;
    if (iVar2 != 0 && iVar3 <= sample->length) {
      sample->length = iVar3;
      lVar4 = (long)iVar2;
      goto LAB_006e7805;
    }
  }
  lVar4 = 0;
LAB_006e7805:
  iVar3 = sample->length;
  ptr = (char *)malloc((long)iVar3);
  sample->data = ptr;
  iVar2 = -1;
  if (ptr != (char *)0x0) {
    dumbfile_getnc(ptr,iVar3,f);
    dumbfile_skip(f,lVar4);
    iVar3 = dumbfile_error(f);
    if (iVar3 == 0) {
      if (sample->length < 1) {
        iVar2 = 0;
      }
      else {
        iVar2 = 0;
        lVar4 = 0;
        do {
          pbVar1 = (byte *)((long)sample->data + lVar4);
          *pbVar1 = *pbVar1 ^ 0x80;
          lVar4 = lVar4 + 1;
        } while (lVar4 < sample->length);
      }
    }
  }
  return iVar2;
}

Assistant:

static int it_mtm_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc(sample->length);

	if (!sample->data)
		return -1;

	dumbfile_getnc((char *)sample->data, sample->length, f);
	dumbfile_skip(f, truncated_size);

	if (dumbfile_error(f))
		return -1;

	for (i = 0; i < sample->length; i++)
		((signed char *)sample->data)[i] ^= 0x80;

	return 0;
}